

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O1

void jpeg_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  JSAMPLE JVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  JSAMPLE *pJVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  undefined1 auVar31 [16];
  int aiStack_154 [7];
  int aiStack_138 [66];
  
  pJVar1 = cinfo->sample_range_limit;
  pvVar2 = compptr->dct_table;
  uVar6 = 9;
  lVar17 = 0;
  do {
    lVar27 = (long)*(short *)((long)coef_block + lVar17 + 0x10);
    if ((((lVar27 == 0) && (*(short *)((long)coef_block + lVar17 + 0x20) == 0)) &&
        (*(short *)((long)coef_block + lVar17 + 0x30) == 0)) &&
       (((*(short *)((long)coef_block + lVar17 + 0x40) == 0 &&
         (*(short *)((long)coef_block + lVar17 + 0x50) == 0)) &&
        ((*(short *)((long)coef_block + lVar17 + 0x60) == 0 &&
         (*(short *)((long)coef_block + lVar17 + 0x70) == 0)))))) {
      iVar7 = (int)*(short *)((long)pvVar2 + lVar17) * (int)*(short *)((long)coef_block + lVar17) *
              4;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0x1c) = iVar7;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0x3c) = iVar7;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0x5c) = iVar7;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0x7c) = iVar7;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0x9c) = iVar7;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0xbc) = iVar7;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0xdc) = iVar7;
      lVar27 = 0xe0;
    }
    else {
      lVar20 = (long)*(short *)((long)pvVar2 + lVar17 + 0x20) *
               (long)*(short *)((long)coef_block + lVar17 + 0x20);
      lVar25 = (long)*(short *)((long)pvVar2 + lVar17 + 0x60) *
               (long)*(short *)((long)coef_block + lVar17 + 0x60);
      lVar16 = (lVar25 + lVar20) * 0x1151;
      lVar13 = lVar25 * -0x3b21 + lVar16;
      lVar16 = lVar20 * 0x187e + lVar16;
      lVar26 = (long)*(short *)((long)pvVar2 + lVar17) * (long)*(short *)((long)coef_block + lVar17)
      ;
      lVar21 = (long)*(short *)((long)pvVar2 + lVar17 + 0x40) *
               (long)*(short *)((long)coef_block + lVar17 + 0x40);
      lVar28 = (long)*(short *)((long)pvVar2 + lVar17 + 0x70) *
               (long)*(short *)((long)coef_block + lVar17 + 0x70);
      lVar22 = (long)*(short *)((long)pvVar2 + lVar17 + 0x50) *
               (long)*(short *)((long)coef_block + lVar17 + 0x50);
      lVar8 = (long)*(short *)((long)pvVar2 + lVar17 + 0x30) *
              (long)*(short *)((long)coef_block + lVar17 + 0x30);
      lVar27 = *(short *)((long)pvVar2 + lVar17 + 0x10) * lVar27;
      lVar20 = (lVar8 + lVar28 + lVar27 + lVar22) * 0x25a1;
      lVar15 = (lVar8 + lVar28) * -0x3ec5 + lVar20;
      lVar20 = (lVar27 + lVar22) * -0xc7c + lVar20;
      lVar25 = (lVar8 + lVar22) * -0x5203;
      lVar4 = (lVar27 + lVar28) * -0x1ccd;
      lVar28 = lVar28 * 0x98e + lVar4 + lVar15;
      lVar15 = lVar8 * 0x6254 + lVar25 + lVar15;
      lVar30 = (lVar21 + lVar26) * 0x2000;
      lVar25 = lVar22 * 0x41b3 + lVar25 + lVar20;
      lVar20 = lVar27 * 0x300b + lVar4 + lVar20;
      lVar8 = lVar30 - lVar16;
      lVar16 = lVar30 + 0x400 + lVar16;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0x1c) = (int)((ulong)(lVar16 + lVar20) >> 0xb);
      lVar4 = (lVar26 - lVar21) * 0x2000;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0xfc) = (int)((ulong)(lVar16 - lVar20) >> 0xb);
      lVar27 = lVar4 - lVar13;
      lVar13 = lVar4 + 0x400 + lVar13;
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0x3c) = (int)((ulong)(lVar13 + lVar15) >> 0xb);
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0xdc) = (int)((ulong)(lVar13 - lVar15) >> 0xb);
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0x5c) = (int)(lVar27 + lVar25 + 0x400U >> 0xb);
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0xbc) =
           (int)((ulong)((lVar27 + 0x400) - lVar25) >> 0xb);
      *(int *)((long)aiStack_154 + lVar17 * 2 + 0x7c) = (int)(lVar8 + lVar28 + 0x400U >> 0xb);
      iVar7 = (int)((ulong)((lVar8 + 0x400) - lVar28) >> 0xb);
      lVar27 = 0x80;
    }
    *(int *)((long)aiStack_154 + lVar17 * 2 + lVar27 + 0x1c) = iVar7;
    uVar6 = uVar6 - 1;
    lVar17 = lVar17 + 2;
  } while (1 < uVar6);
  lVar17 = 7;
  do {
    pJVar18 = (JSAMPLE *)(*(long *)((long)output_buf + lVar17 + -7) + (ulong)output_col);
    iVar7 = aiStack_154[lVar17 + 1];
    if ((((iVar7 == 0) && (aiStack_154[lVar17 + 2] == 0)) &&
        ((aiStack_154[lVar17 + 3] == 0 &&
         (((aiStack_154[lVar17 + 4] == 0 && (aiStack_154[lVar17 + 5] == 0)) &&
          (aiStack_154[lVar17 + 6] == 0)))))) && (aiStack_154[lVar17 + 7] == 0)) {
      JVar5 = pJVar1[(ulong)(aiStack_154[lVar17] + 0x10U >> 5 & 0x3ff) + 0x80];
      auVar31 = pshuflw(ZEXT216(CONCAT11(JVar5,JVar5)),ZEXT216(CONCAT11(JVar5,JVar5)),0);
      *(int *)pJVar18 = auVar31._0_4_;
      pJVar18[4] = JVar5;
      pJVar18[5] = JVar5;
      pJVar18[6] = JVar5;
      lVar27 = 7;
    }
    else {
      iVar23 = (aiStack_154[lVar17 + 6] + aiStack_154[lVar17 + 2]) * 0x1151;
      iVar14 = aiStack_154[lVar17 + 6] * -0x3b21 + iVar23;
      iVar23 = aiStack_154[lVar17 + 2] * 0x187e + iVar23;
      iVar12 = aiStack_154[lVar17 + 7];
      iVar29 = aiStack_154[lVar17 + 5];
      iVar19 = aiStack_154[lVar17 + 3];
      iVar9 = (iVar12 + iVar19 + iVar29 + iVar7) * 0x25a1;
      iVar3 = (iVar12 + iVar19) * -0x3ec5 + iVar9;
      iVar9 = (iVar29 + iVar7) * -0xc7c + iVar9;
      iVar10 = (iVar29 + iVar19) * -0x5203;
      iVar11 = (iVar12 + iVar7) * -0x1ccd;
      iVar12 = iVar12 * 0x98e + iVar11 + iVar3;
      iVar3 = iVar19 * 0x6254 + iVar10 + iVar3;
      iVar24 = (aiStack_154[lVar17 + 4] + aiStack_154[lVar17]) * 0x2000;
      iVar19 = (aiStack_154[lVar17] - aiStack_154[lVar17 + 4]) * 0x2000;
      iVar10 = iVar29 * 0x41b3 + iVar10 + iVar9;
      iVar9 = iVar7 * 0x300b + iVar11 + iVar9;
      iVar29 = iVar24 - iVar23;
      iVar23 = iVar24 + 0x20000 + iVar23;
      iVar7 = iVar19 - iVar14;
      iVar14 = iVar19 + 0x20000 + iVar14;
      *pJVar18 = pJVar1[(ulong)((uint)(iVar23 + iVar9) >> 0x12 & 0x3ff) + 0x80];
      pJVar18[7] = pJVar1[(ulong)((uint)(iVar23 - iVar9) >> 0x12 & 0x3ff) + 0x80];
      pJVar18[1] = pJVar1[(ulong)((uint)(iVar14 + iVar3) >> 0x12 & 0x3ff) + 0x80];
      pJVar18[6] = pJVar1[(ulong)((uint)(iVar14 - iVar3) >> 0x12 & 0x3ff) + 0x80];
      pJVar18[2] = pJVar1[(ulong)(iVar7 + iVar10 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
      pJVar18[5] = pJVar1[(ulong)((uint)((iVar7 + 0x20000) - iVar10) >> 0x12 & 0x3ff) + 0x80];
      pJVar18[3] = pJVar1[(ulong)(iVar29 + iVar12 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
      JVar5 = pJVar1[(ulong)((uint)((iVar29 + 0x20000) - iVar12) >> 0x12 & 0x3ff) + 0x80];
      lVar27 = 4;
    }
    pJVar18[lVar27] = JVar5;
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x47);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_islow(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp3;
  JLONG tmp10, tmp11, tmp12, tmp13;
  JLONG z1, z2, z3, z4, z5;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];      /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                             quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);

    tmp0 = LEFT_SHIFT(z2 + z3, CONST_BITS);
    tmp1 = LEFT_SHIFT(z2 - z3, CONST_BITS);

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);

    z1 = tmp0 + tmp3;
    z2 = tmp1 + tmp2;
    z3 = tmp0 + tmp2;
    z4 = tmp1 + tmp3;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    tmp0 += z1 + z3;
    tmp1 += z2 + z4;
    tmp2 += z2 + z3;
    tmp3 += z1 + z4;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    wsptr[DCTSIZE * 0] = (int)DESCALE(tmp10 + tmp3, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 7] = (int)DESCALE(tmp10 - tmp3, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 1] = (int)DESCALE(tmp11 + tmp2, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 6] = (int)DESCALE(tmp11 - tmp2, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 2] = (int)DESCALE(tmp12 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 5] = (int)DESCALE(tmp12 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 3] = (int)DESCALE(tmp13 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 4] = (int)DESCALE(tmp13 - tmp0, CONST_BITS - PASS1_BITS);

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    tmp0 = LEFT_SHIFT((JLONG)wsptr[0] + (JLONG)wsptr[4], CONST_BITS);
    tmp1 = LEFT_SHIFT((JLONG)wsptr[0] - (JLONG)wsptr[4], CONST_BITS);

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = (JLONG)wsptr[7];
    tmp1 = (JLONG)wsptr[5];
    tmp2 = (JLONG)wsptr[3];
    tmp3 = (JLONG)wsptr[1];

    z1 = tmp0 + tmp3;
    z2 = tmp1 + tmp2;
    z3 = tmp0 + tmp2;
    z4 = tmp1 + tmp3;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    tmp0 += z1 + z3;
    tmp1 += z2 + z4;
    tmp2 += z2 + z3;
    tmp3 += z1 + z4;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp3,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[7] = range_limit[(int)DESCALE(tmp10 - tmp3,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp11 + tmp2,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)DESCALE(tmp11 - tmp2,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)DESCALE(tmp12 + tmp1,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)DESCALE(tmp12 - tmp1,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)DESCALE(tmp13 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)DESCALE(tmp13 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}